

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void __thiscall
CServerBrowser::Set(CServerBrowser *this,NETADDR *Addr,int SetType,int Token,CServerInfo *pInfo)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  CServerEntry *pCVar4;
  int64 iVar5;
  int64 iVar6;
  int64 *piVar7;
  int iVar8;
  
  if (SetType != 3) {
    if (SetType == 2) {
      if ((this->m_RefreshFlags & 1) == 0) {
        return;
      }
    }
    else {
      if (SetType != 1) {
        return;
      }
      if ((this->m_RefreshFlags & 1) == 0) {
        return;
      }
      this->m_MasterRefreshTime = 0;
    }
    pCVar4 = Find(this,0,Addr);
    if (pCVar4 != (CServerEntry *)0x0) {
      return;
    }
    pCVar4 = Add(this,0,Addr);
    QueueRequest(this,pCVar4);
    if (pCVar4 == (CServerEntry *)0x0) {
      return;
    }
    goto LAB_00122819;
  }
  if ((((this->m_RefreshFlags & 1) == 0) ||
      (pCVar4 = Find(this,0,Addr), pCVar4 == (CServerEntry *)0x0)) || (pCVar4->m_InfoState != 1)) {
LAB_00122767:
    if ((this->m_RefreshFlags & 2) == 0) {
      return;
    }
    lVar1 = this->m_BroadcastTime;
    iVar5 = time_freq();
    iVar6 = time_get();
    if (iVar5 + lVar1 < iVar6) {
      return;
    }
    iVar8 = 1;
    pCVar4 = Add(this,1,Addr);
    if (pCVar4 == (CServerEntry *)0x0) {
      return;
    }
    bVar2 = true;
  }
  else {
    iVar8 = 0;
    bVar2 = false;
    if (pCVar4->m_CurrentToken != Token) goto LAB_00122767;
  }
  SetInfo(this,iVar8,pCVar4,pInfo);
  iVar5 = time_get();
  piVar7 = &pCVar4->m_RequestTime;
  if (bVar2) {
    piVar7 = &this->m_BroadcastTime;
  }
  lVar1 = *piVar7;
  iVar6 = time_freq();
  iVar3 = (int)(((iVar5 - lVar1) * 1000) / iVar6);
  iVar8 = 999;
  if (iVar3 < 999) {
    iVar8 = iVar3;
  }
  (pCVar4->m_Info).m_Latency = iVar8;
  this->m_InfoUpdated = true;
  RemoveRequest(this,pCVar4);
LAB_00122819:
  CServerBrowserFilter::Sort
            (&this->m_ServerBrowserFilter,
             this->m_aServerlist[this->m_ActServerlistType].m_ppServerlist,
             this->m_aServerlist[this->m_ActServerlistType].m_NumServers,1);
  return;
}

Assistant:

void CServerBrowser::Set(const NETADDR &Addr, int SetType, int Token, const CServerInfo *pInfo)
{
	CServerEntry *pEntry = 0;
	switch(SetType)
	{
	case SET_MASTER_ADD:
		{
			if(!(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET))
				return;

			m_MasterRefreshTime = 0;

			if(!Find(IServerBrowser::TYPE_INTERNET, Addr))
			{
				pEntry = Add(IServerBrowser::TYPE_INTERNET, Addr);
				QueueRequest(pEntry);
			}
		}
		break;
	case SET_FAV_ADD:
		{
			if(!(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET))
				return;

			if(!Find(IServerBrowser::TYPE_INTERNET, Addr))
			{
				pEntry = Add(IServerBrowser::TYPE_INTERNET, Addr);
				QueueRequest(pEntry);
			}
		}
		break;
	case SET_TOKEN:
		{
			int Type;

			// internet entry
			if(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET)
			{
				Type = IServerBrowser::TYPE_INTERNET;
				pEntry = Find(Type, Addr);
				if(pEntry && (pEntry->m_InfoState != CServerEntry::STATE_PENDING || Token != pEntry->m_CurrentToken))
					pEntry = 0;
			}

			// lan entry
			if(!pEntry && (m_RefreshFlags&IServerBrowser::REFRESHFLAG_LAN) && m_BroadcastTime+time_freq() >= time_get())
			{
				Type = IServerBrowser::TYPE_LAN;
				pEntry = Add(Type, Addr);
			}

			// set info
			if(pEntry)
			{
				SetInfo(Type, pEntry, *pInfo);
				if(Type == IServerBrowser::TYPE_LAN)
					pEntry->m_Info.m_Latency = minimum(static_cast<int>((time_get()-m_BroadcastTime)*1000/time_freq()), 999);
				else
					pEntry->m_Info.m_Latency = minimum(static_cast<int>((time_get()-pEntry->m_RequestTime)*1000/time_freq()), 999);
				m_InfoUpdated = true;
				RemoveRequest(pEntry);
			}
		}
	}

	if(pEntry)
		m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FORCE);
}